

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiID IVar1;
  
  ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
  IVar1 = ctx->HookIdNext + 1;
  ctx->HookIdNext = IVar1;
  *(ImGuiID *)((ctx->Hooks).Data + (long)(ctx->Hooks).Size * 0x20 + -0x20) = IVar1;
  return ctx->HookIdNext;
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}